

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_fifo.c
# Opt level: O0

int mk_fifo_worker_read(void *event)

{
  undefined4 *puVar1;
  int iVar2;
  size_t size_00;
  void *pvVar3;
  ssize_t sVar4;
  mk_fifo_queue *pmVar5;
  mk_fifo_queue *fq;
  mk_fifo_worker *fw;
  mk_fifo_msg *fm;
  ssize_t bytes;
  size_t size;
  char *tmp;
  int available;
  void *event_local;
  
  tmp._4_4_ = (int)*(undefined8 *)((long)event + 0x70) - (int)*(undefined8 *)((long)event + 0x68);
  if (tmp._4_4_ < 2) {
    size_00 = *(long *)((long)event + 0x70) + 0x4000;
    pvVar3 = mk_mem_realloc(*(void **)((long)event + 0x60),size_00);
    if (pvVar3 == (void *)0x0) {
      perror("realloc");
      return -1;
    }
    *(void **)((long)event + 0x60) = pvVar3;
    *(size_t *)((long)event + 0x70) = size_00;
    tmp._4_4_ = (int)*(undefined8 *)((long)event + 0x70) - (int)*(undefined8 *)((long)event + 0x68);
  }
  sVar4 = read(*(int *)((long)event + 0x4c),
               (void *)(*(long *)((long)event + 0x60) + *(long *)((long)event + 0x68)),
               (long)tmp._4_4_);
  if (sVar4 == 0) {
    event_local._4_4_ = -1;
  }
  else if (sVar4 == -1) {
    perror("read");
    event_local._4_4_ = -1;
  }
  else {
    *(ssize_t *)((long)event + 0x68) = sVar4 + *(long *)((long)event + 0x68);
    while ((*(long *)((long)event + 0x68) != 0 &&
           (iVar2 = fifo_is_msg_ready((mk_fifo_worker *)event), iVar2 == 1))) {
      puVar1 = *(undefined4 **)((long)event + 0x60);
      pmVar5 = mk_fifo_queue_get(*(mk_fifo **)((long)event + 0x78),
                                 (uint)*(ushort *)((long)puVar1 + 6));
      if (pmVar5 == (mk_fifo_queue *)0x0) {
        fprintf(_stderr,"[fifo worker read] invalid queue id %i\n",
                (ulong)*(ushort *)((long)puVar1 + 6));
        fifo_drop_msg((mk_fifo_worker *)event);
      }
      else {
        if (pmVar5->cb_message != (_func_void_mk_fifo_queue_ptr_void_ptr_size_t_void_ptr *)0x0) {
          (*pmVar5->cb_message)(pmVar5,puVar1 + 2,(size_t)*puVar1,pmVar5->data);
        }
        fifo_drop_msg((mk_fifo_worker *)event);
      }
    }
    event_local._4_4_ = 0;
  }
  return event_local._4_4_;
}

Assistant:

int mk_fifo_worker_read(void *event)
{
    int available;
    char *tmp;
    size_t size;
    ssize_t bytes;
    struct mk_fifo_msg *fm;
    struct mk_fifo_worker *fw;
    struct mk_fifo_queue *fq;

    fw = (struct mk_fifo_worker *) event;

    /* Check available space */
    available = fw->buf_size - fw->buf_len;
    if (available <= 1) {
        size = fw->buf_size + (MK_FIFO_BUF_SIZE / 2);
        tmp = mk_mem_realloc(fw->buf_data, size);
        if (!tmp) {
            perror("realloc");
            return -1;
        }
        fw->buf_data = tmp;
        fw->buf_size = size;
        available = fw->buf_size - fw->buf_len;
    }

    /* Read data from pipe */
#ifdef _WIN32
    bytes = recv(fw->channel[0], fw->buf_data + fw->buf_len, available, 0);
#else
    bytes = read(fw->channel[0], fw->buf_data + fw->buf_len, available);
#endif

    if (bytes == 0) {
        return -1;
    }
    else if (bytes == -1){
        perror("read");
        return -1;
    }

    fw->buf_len += bytes;

    /* Find messages and trigger callbacks */
    while (fw->buf_len > 0) {
        if (fifo_is_msg_ready(fw) == MK_TRUE) {
            /* we got a complete message */
            fm = (struct mk_fifo_msg *) fw->buf_data;
            fq = mk_fifo_queue_get(fw->fifo, fm->queue_id);
            if (!fq) {
                /* Invalid queue */
                fprintf(stderr, "[fifo worker read] invalid queue id %i\n",
                        fm->queue_id);
                fifo_drop_msg(fw);
                continue;
            }

            /* Trigger callback if any */
            if (fq->cb_message) {
                fq->cb_message(fq, fm->data, fm->length, fq->data);
            }
            fifo_drop_msg(fw);
        }
        else {
            /* msg not ready */
            break;
        }
    }

    return 0;
}